

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

LPSTR CharNextExA(WORD CodePage,LPCSTR lpCurrentChar,DWORD dwFlags)

{
  BOOL BVar1;
  int iVar2;
  bool bVar3;
  LPSTR local_28;
  LPSTR pRet;
  DWORD dwFlags_local;
  LPCSTR lpCurrentChar_local;
  WORD CodePage_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  local_28 = lpCurrentChar;
  if ((lpCurrentChar != (LPCSTR)0x0) && (*lpCurrentChar != '\0')) {
    bVar3 = false;
    if (lpCurrentChar[1] != '\0') {
      BVar1 = IsDBCSLeadByteEx((uint)CodePage,*lpCurrentChar);
      bVar3 = BVar1 != 0;
    }
    iVar2 = 1;
    if (bVar3) {
      iVar2 = 2;
    }
    local_28 = lpCurrentChar + iVar2;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_28;
}

Assistant:

LPSTR
PALAPI
CharNextExA(
    IN WORD CodePage,
    IN LPCSTR lpCurrentChar,
    IN DWORD dwFlags)
{
    LPSTR pRet = (LPSTR) lpCurrentChar;

    PERF_ENTRY(CharNextExA);
    ENTRY("CharNextExA (CodePage=%hu, lpCurrentChar=%p (%s), dwFlags=%#x)\n",
    CodePage, lpCurrentChar?lpCurrentChar:"NULL", lpCurrentChar?lpCurrentChar:"NULL", dwFlags);

    if ((lpCurrentChar != NULL) && (*lpCurrentChar != 0))
    {
        pRet += (*(lpCurrentChar+1) != 0) &&
            IsDBCSLeadByteEx(CodePage, *lpCurrentChar) ?  2 : 1;
    }

    LOGEXIT("CharNextExA returns LPSTR:%p (%s)\n", pRet, pRet);
    PERF_EXIT(CharNextExA);
    return pRet;
}